

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall OpenMPDirective::generateDOT(OpenMPDirective *this)

{
  OpenMPClause *pOVar1;
  uint uVar2;
  bool bVar3;
  OpenMPDirectiveKind OVar4;
  undefined8 uVar5;
  char *pcVar6;
  ostream *poVar7;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  reference ppcVar8;
  size_type sVar9;
  reference ppOVar10;
  string local_1440 [32];
  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
  local_1420;
  OpenMPClause **local_1418;
  uint local_140c;
  iterator iStack_1408;
  int clause_index;
  iterator iter;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *clauses;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1298;
  undefined1 local_1278 [8];
  string node_id_2;
  undefined1 local_1250 [8];
  string tkind_3;
  string proc_name;
  undefined1 local_1208 [8];
  string indent_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  char **local_1068;
  allocator<char> local_1059;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8;
  string local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e58;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_e38;
  char **local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  string local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  undefined1 local_be8 [8];
  string node_id_1;
  undefined1 local_bc0 [8];
  string tkind_2;
  string expr_name_2;
  string list_name_2;
  undefined1 local_b58 [4];
  int list_index_2;
  string combiner;
  string id;
  iterator list_item_2;
  vector<const_char_*,_std::allocator<const_char_*>_> *list_2;
  undefined1 local_b00 [8];
  string indent_2;
  allocator<char> local_ad1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  string local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_8b0;
  char **local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  string local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  allocator<char> local_7b9;
  undefined1 local_7b8 [8];
  string tkind_1;
  string expr_name_1;
  string list_name_1;
  iterator iStack_750;
  int list_index_1;
  iterator list_item_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *list_1;
  undefined1 local_738 [8];
  string indent_1;
  allocator<char> local_709;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_4e8;
  char **local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  allocator<char> local_3f1;
  undefined1 local_3f0 [8];
  string tkind;
  string expr_name;
  string list_name;
  iterator iStack_388;
  int list_index;
  iterator list_item;
  vector<const_char_*,_std::allocator<const_char_*>_> *list;
  undefined1 local_370 [8];
  string indent;
  string local_348 [8];
  string node_id;
  ofstream output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [8];
  string current_line;
  undefined1 local_30 [4];
  OpenMPDirectiveKind kind;
  string directive_kind;
  OpenMPDirective *this_local;
  
  directive_kind.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  OVar4 = getKind(this);
  switch(OVar4) {
  case OMPD_for_simd:
    std::__cxx11::string::operator=((string *)local_30,"for_simd ");
    break;
  case OMPD_do_simd:
    std::__cxx11::string::operator=((string *)local_30,"do_simd ");
    break;
  case OMPD_parallel_for_simd:
    std::__cxx11::string::operator=((string *)local_30,"parallel_for_simd ");
    break;
  default:
    toString_abi_cxx11_((string *)((long)&current_line.field_2 + 8),this);
    std::__cxx11::string::operator=
              ((string *)local_30,(string *)(current_line.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(current_line.field_2._M_local_buf + 8));
    break;
  case OMPD_declare_simd:
    std::__cxx11::string::operator=((string *)local_30,"declare_simd ");
    break;
  case OMPD_distribute_simd:
    std::__cxx11::string::operator=((string *)local_30,"distribute_simd ");
    break;
  case OMPD_distribute_parallel_for:
    std::__cxx11::string::operator=((string *)local_30,"distribute_parallel_for ");
    break;
  case OMPD_distribute_parallel_do:
    std::__cxx11::string::operator=((string *)local_30,"distribute_parallel_do ");
    break;
  case OMPD_distribute_parallel_for_simd:
    std::__cxx11::string::operator=((string *)local_30,"distribute_parallel_for_simd ");
    break;
  case OMPD_distribute_parallel_do_simd:
    std::__cxx11::string::operator=((string *)local_30,"distribute_parallel_do_simd ");
    break;
  case OMPD_cancellation_point:
    std::__cxx11::string::operator=((string *)local_30,"cancellation_point ");
    break;
  case OMPD_declare_reduction:
    std::__cxx11::string::operator=((string *)local_30,"declare_reduction ");
    break;
  case OMPD_declare_mapper:
    std::__cxx11::string::operator=((string *)local_30,"declare_mapper ");
    break;
  case OMPD_parallel_for:
    std::__cxx11::string::operator=((string *)local_30,"parallel_for ");
    break;
  case OMPD_parallel_do:
    std::__cxx11::string::operator=((string *)local_30,"parallel_do ");
    break;
  case OMPD_parallel_loop:
    std::__cxx11::string::operator=((string *)local_30,"parallel_loop ");
    break;
  case OMPD_parallel_sections:
    std::__cxx11::string::operator=((string *)local_30,"parallel_sections ");
    break;
  case OMPD_parallel_workshare:
    std::__cxx11::string::operator+=((string *)local_30,"parallel_workshare ");
    break;
  case OMPD_parallel_master:
    std::__cxx11::string::operator+=((string *)local_30,"parallel_master ");
    break;
  case OMPD_master_taskloop:
    std::__cxx11::string::operator+=((string *)local_30,"master_taskloop ");
    break;
  case OMPD_master_taskloop_simd:
    std::__cxx11::string::operator+=((string *)local_30,"master_taskloop_simd ");
    break;
  case OMPD_parallel_master_taskloop:
    std::__cxx11::string::operator+=((string *)local_30,"parallel_master_taskloop ");
    break;
  case OMPD_parallel_master_taskloop_simd:
    std::__cxx11::string::operator+=((string *)local_30,"parallel_master_taskloop_simd ");
    break;
  case OMPD_taskloop_simd:
    std::__cxx11::string::operator=((string *)local_30,"taskloop_simd ");
    break;
  case OMPD_target_data:
    std::__cxx11::string::operator=((string *)local_30,"target_data ");
    break;
  case OMPD_target_enter_data:
    std::__cxx11::string::operator=((string *)local_30,"target_enter_data ");
    break;
  case OMPD_target_update:
    std::__cxx11::string::operator=((string *)local_30,"target_update ");
    break;
  case OMPD_target_exit_data:
    std::__cxx11::string::operator=((string *)local_30,"target_exit_data ");
    break;
  case OMPD_declare_target:
    std::__cxx11::string::operator=((string *)local_30,"declare_target ");
    break;
  case OMPD_end_declare_target:
    std::__cxx11::string::operator=((string *)local_30,"end_declare_target ");
    break;
  case OMPD_teams_distribute:
    std::__cxx11::string::operator+=((string *)local_30,"teams_distribute ");
    break;
  case OMPD_teams_distribute_simd:
    std::__cxx11::string::operator+=((string *)local_30,"teams_distribute_simd ");
    break;
  case OMPD_teams_distribute_parallel_for:
    std::__cxx11::string::operator+=((string *)local_30,"teams_distribute_parallel_for ");
    break;
  case OMPD_teams_distribute_parallel_for_simd:
    std::__cxx11::string::operator+=((string *)local_30,"teams_distribute_parallel_for_simd ");
    break;
  case OMPD_teams_loop:
    std::__cxx11::string::operator+=((string *)local_30,"teams_loop ");
    break;
  case OMPD_target_parallel:
    std::__cxx11::string::operator+=((string *)local_30,"target_parallel ");
    break;
  case OMPD_target_parallel_for:
    std::__cxx11::string::operator+=((string *)local_30,"target_parallel_for ");
    break;
  case OMPD_target_parallel_for_simd:
    std::__cxx11::string::operator+=((string *)local_30,"target_parallel_for_simd ");
    break;
  case OMPD_target_parallel_loop:
    std::__cxx11::string::operator+=((string *)local_30,"target_parallel_loop ");
    break;
  case OMPD_target_simd:
    std::__cxx11::string::operator+=((string *)local_30,"target_simd ");
    break;
  case OMPD_target_teams:
    std::__cxx11::string::operator+=((string *)local_30,"target_teams ");
    break;
  case OMPD_target_teams_distribute:
    std::__cxx11::string::operator+=((string *)local_30,"target_teams_distribute ");
    break;
  case OMPD_target_teams_distribute_simd:
    std::__cxx11::string::operator+=((string *)local_30,"target_teams_distribute_simd ");
    break;
  case OMPD_target_teams_loop:
    std::__cxx11::string::operator+=((string *)local_30,"target_teams_loop ");
    break;
  case OMPD_target_teams_distribute_parallel_for:
    std::__cxx11::string::operator+=((string *)local_30,"target_teams_distribute_parallel_for ");
    break;
  case OMPD_target_teams_distribute_parallel_for_simd:
    std::__cxx11::string::operator+=
              ((string *)local_30,"target_teams_distribute_parallel_for simd ");
    break;
  case OMPD_teams_distribute_parallel_do:
    std::__cxx11::string::operator+=((string *)local_30,"teams distribute parallel do ");
    break;
  case OMPD_teams_distribute_parallel_do_simd:
    std::__cxx11::string::operator+=((string *)local_30,"teams distribute parallel do simd ");
    break;
  case OMPD_target_parallel_do:
    std::__cxx11::string::operator+=((string *)local_30,"target parallel do ");
    break;
  case OMPD_target_parallel_do_simd:
    std::__cxx11::string::operator+=((string *)local_30,"target parallel do simd ");
    break;
  case OMPD_target_teams_distribute_parallel_do:
    std::__cxx11::string::operator+=((string *)local_30,"target teams distribute parallel do ");
    break;
  case OMPD_target_teams_distribute_parallel_do_simd:
    std::__cxx11::string::operator+=((string *)local_30,"target teams distribute parallel do simd ")
    ;
  }
  std::__cxx11::string::string(local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename.field_2 + 8),"graph OpenMPIR_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename.field_2 + 8)," {\n");
  std::__cxx11::string::operator=(local_88,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&local_128,(ulong)local_30);
  std::operator+(&local_108,"OpenMPIR_",&local_128);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_108,".dot");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::ofstream((undefined1 *)((long)&node_id.field_2 + 8),uVar5,0x10);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
  poVar7 = std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),"\t");
  pcVar6 = (char *)std::__cxx11::string::c_str();
  poVar7 = std::operator<<(poVar7,pcVar6);
  std::operator<<(poVar7,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,"",(allocator<char> *)(indent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(indent.field_2._M_local_buf + 0xf));
  switch(OVar4) {
  case OMPD_declare_simd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1208,1,'\t',(allocator<char> *)(proc_name.field_2._M_local_buf + 0xf)
              );
    std::allocator<char>::~allocator((allocator<char> *)(proc_name.field_2._M_local_buf + 0xf));
    OpenMPDeclareSimdDirective::getProcName_abi_cxx11_
              ((string *)((long)&tkind_3.field_2 + 8),(OpenMPDeclareSimdDirective *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1250,"declare_simd",
               (allocator<char> *)(node_id_2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(node_id_2.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1250,
                   "_proc_name");
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&tkind_3.field_2 + 8),"");
    if (bVar3) {
      std::operator+(&local_12f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1208
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1250);
      std::operator+(&local_12d8,&local_12f8," -- ");
      std::operator+(&local_12b8,&local_12d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1278
                    );
      std::operator+(&local_1298,&local_12b8,"\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_1298);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::~string((string *)&local_12b8);
      std::__cxx11::string::~string((string *)&local_12d8);
      std::__cxx11::string::~string((string *)&local_12f8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
      std::operator+(&local_13d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1208
                     ,"\t");
      std::operator+(&local_13b8,&local_13d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1278
                    );
      std::operator+(&local_1398,&local_13b8," [label = \"");
      std::operator+(&local_1378,&local_1398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1278
                    );
      std::operator+(&local_1358,&local_1378,"\\n ");
      std::operator+(&local_1338,&local_1358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_3.field_2 + 8));
      std::operator+(&local_1318,&local_1338,"\"]\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_1318);
      std::__cxx11::string::~string((string *)&local_1318);
      std::__cxx11::string::~string((string *)&local_1338);
      std::__cxx11::string::~string((string *)&local_1358);
      std::__cxx11::string::~string((string *)&local_1378);
      std::__cxx11::string::~string((string *)&local_1398);
      std::__cxx11::string::~string((string *)&local_13b8);
      std::__cxx11::string::~string((string *)&local_13d8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    }
    std::__cxx11::string::~string((string *)local_1278);
    std::__cxx11::string::~string((string *)local_1250);
    std::__cxx11::string::~string((string *)(tkind_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_1208);
    break;
  default:
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&clauses,(ulong)local_30);
    std::__cxx11::string::operator=(local_348,(string *)&clauses);
    std::__cxx11::string::~string((string *)&clauses);
    break;
  case OMPD_allocate:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_370,1,'\t',(allocator<char> *)((long)&list + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&list + 7));
    list_item._M_current =
         (char **)OpenMPAllocateDirective::getAllocateList((OpenMPAllocateDirective *)this);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffc78);
    list_name.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)(expr_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(tkind.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3f0,"allocate",&local_3f1);
    std::allocator<char>::~allocator(&local_3f1);
    std::operator+(&local_438,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
                   "_directive_list_");
    std::__cxx11::to_string(&local_458,0);
    std::operator+(&local_418,&local_438,&local_458);
    std::__cxx11::string::operator=
              ((string *)(expr_name.field_2._M_local_buf + 8),(string *)&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_438);
    std::operator+(&local_4d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
    std::operator+(&local_4b8,&local_4d8," -- ");
    std::operator+(&local_498,&local_4b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expr_name.field_2 + 8));
    std::operator+(&local_478,&local_498,"\n");
    std::__cxx11::string::operator=(local_88,(string *)&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    local_4e0 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (list_item._M_current);
    iStack_388 = (iterator)local_4e0;
    while( true ) {
      local_4e8._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              (list_item._M_current);
      bVar3 = __gnu_cxx::operator!=(&stack0xfffffffffffffc78,&local_4e8);
      if (!bVar3) break;
      std::operator+(&local_528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name.field_2 + 8),"_expr");
      std::__cxx11::to_string(&local_548,list_name.field_2._12_4_);
      std::operator+(&local_508,&local_528,&local_548);
      std::__cxx11::string::operator=
                ((string *)(tkind.field_2._M_local_buf + 8),(string *)&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_528);
      list_name.field_2._12_4_ = list_name.field_2._12_4_ + 1;
      std::operator+(&local_5e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370)
      ;
      std::operator+(&local_5c8,&local_5e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name.field_2 + 8));
      std::operator+(&local_5a8,&local_5c8," -- ");
      std::operator+(&local_588,&local_5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind.field_2 + 8));
      std::operator+(&local_568,&local_588,"\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5e8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
      std::operator+(&local_6e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370)
      ;
      std::operator+(&local_6c8,&local_6e8,"\t");
      std::operator+(&local_6a8,&local_6c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind.field_2 + 8));
      std::operator+(&local_688,&local_6a8," [label = \"");
      std::operator+(&local_668,&local_688,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind.field_2 + 8));
      std::operator+(&local_648,&local_668,"\\n ");
      ppcVar8 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffffc78);
      pcVar6 = *ppcVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,pcVar6,&local_709);
      std::operator+(&local_628,&local_648,&local_708);
      std::operator+(&local_608,&local_628,"\"]\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_608);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_688);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::__cxx11::string::~string((string *)&local_6e8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
      indent_1.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           ::operator++(&stack0xfffffffffffffc78,0);
    }
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::string::~string((string *)(tkind.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(expr_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_370);
    break;
  case OMPD_threadprivate:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_738,1,'\t',(allocator<char> *)((long)&list_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&list_1 + 7));
    list_item_1._M_current =
         (char **)OpenMPThreadprivateDirective::getThreadprivateList
                            ((OpenMPThreadprivateDirective *)this);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffff8b0);
    list_name_1.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)(expr_name_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(tkind_1.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7b8,"threadprivate",&local_7b9);
    std::allocator<char>::~allocator(&local_7b9);
    std::operator+(&local_800,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8,
                   "_directive_list_");
    std::__cxx11::to_string(&local_820,0);
    std::operator+(&local_7e0,&local_800,&local_820);
    std::__cxx11::string::operator=
              ((string *)(expr_name_1.field_2._M_local_buf + 8),(string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_800);
    std::operator+(&local_8a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8);
    std::operator+(&local_880,&local_8a0," -- ");
    std::operator+(&local_860,&local_880,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expr_name_1.field_2 + 8));
    std::operator+(&local_840,&local_860,"\n");
    std::__cxx11::string::operator=(local_88,(string *)&local_840);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::string::~string((string *)&local_880);
    std::__cxx11::string::~string((string *)&local_8a0);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    local_8a8 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (list_item_1._M_current);
    iStack_750 = (iterator)local_8a8;
    while( true ) {
      local_8b0._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              (list_item_1._M_current);
      bVar3 = __gnu_cxx::operator!=(&stack0xfffffffffffff8b0,&local_8b0);
      if (!bVar3) break;
      std::operator+(&local_8f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_1.field_2 + 8),"_expr");
      std::__cxx11::to_string(&local_910,list_name_1.field_2._12_4_);
      std::operator+(&local_8d0,&local_8f0,&local_910);
      std::__cxx11::string::operator=
                ((string *)(tkind_1.field_2._M_local_buf + 8),(string *)&local_8d0);
      std::__cxx11::string::~string((string *)&local_8d0);
      std::__cxx11::string::~string((string *)&local_910);
      std::__cxx11::string::~string((string *)&local_8f0);
      list_name_1.field_2._12_4_ = list_name_1.field_2._12_4_ + 1;
      std::operator+(&local_9b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738)
      ;
      std::operator+(&local_990,&local_9b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_1.field_2 + 8));
      std::operator+(&local_970,&local_990," -- ");
      std::operator+(&local_950,&local_970,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_1.field_2 + 8));
      std::operator+(&local_930,&local_950,"\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_930);
      std::__cxx11::string::~string((string *)&local_930);
      std::__cxx11::string::~string((string *)&local_950);
      std::__cxx11::string::~string((string *)&local_970);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_9b0);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
      std::operator+(&local_ab0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738)
      ;
      std::operator+(&local_a90,&local_ab0,"\t");
      std::operator+(&local_a70,&local_a90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_1.field_2 + 8));
      std::operator+(&local_a50,&local_a70," [label = \"");
      std::operator+(&local_a30,&local_a50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_1.field_2 + 8));
      std::operator+(&local_a10,&local_a30,"\\n ");
      ppcVar8 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffff8b0);
      pcVar6 = *ppcVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad0,pcVar6,&local_ad1);
      std::operator+(&local_9f0,&local_a10,&local_ad0);
      std::operator+(&local_9d0,&local_9f0,"\"]\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_9d0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::string::~string((string *)&local_9f0);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::allocator<char>::~allocator(&local_ad1);
      std::__cxx11::string::~string((string *)&local_a10);
      std::__cxx11::string::~string((string *)&local_a30);
      std::__cxx11::string::~string((string *)&local_a50);
      std::__cxx11::string::~string((string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_a90);
      std::__cxx11::string::~string((string *)&local_ab0);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
      indent_2.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           ::operator++(&stack0xfffffffffffff8b0,0);
    }
    std::__cxx11::string::~string((string *)local_7b8);
    std::__cxx11::string::~string((string *)(tkind_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(expr_name_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_738);
    break;
  case OMPD_declare_reduction:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b00,1,'\t',(allocator<char> *)((long)&list_2 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&list_2 + 7));
    this_00 = OpenMPDeclareReductionDirective::getTypenameList
                        ((OpenMPDeclareReductionDirective *)this);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                       *)((long)&id.field_2 + 8));
    OpenMPDeclareReductionDirective::getIdentifier_abi_cxx11_
              ((string *)((long)&combiner.field_2 + 8),(OpenMPDeclareReductionDirective *)this);
    OpenMPDeclareReductionDirective::getCombiner_abi_cxx11_
              ((string *)local_b58,(OpenMPDeclareReductionDirective *)this);
    list_name_2.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)(expr_name_2.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(tkind_2.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_bc0,"declare_reduction",
               (allocator<char> *)(node_id_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(node_id_1.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0,
                   "_reduction_identifier");
    std::operator+(&local_c68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0);
    std::operator+(&local_c48,&local_c68," -- ");
    std::operator+(&local_c28,&local_c48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
    std::operator+(&local_c08,&local_c28,"\n");
    std::__cxx11::string::operator=(local_88,(string *)&local_c08);
    std::__cxx11::string::~string((string *)&local_c08);
    std::__cxx11::string::~string((string *)&local_c28);
    std::__cxx11::string::~string((string *)&local_c48);
    std::__cxx11::string::~string((string *)&local_c68);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    std::operator+(&local_d48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
                   "\t");
    std::operator+(&local_d28,&local_d48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
    std::operator+(&local_d08,&local_d28," [label = \"");
    std::operator+(&local_ce8,&local_d08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
    std::operator+(&local_cc8,&local_ce8,"\\n ");
    std::operator+(&local_ca8,&local_cc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&combiner.field_2 + 8));
    std::operator+(&local_c88,&local_ca8,"\"]\n");
    std::__cxx11::string::operator=(local_88,(string *)&local_c88);
    std::__cxx11::string::~string((string *)&local_c88);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::__cxx11::string::~string((string *)&local_cc8);
    std::__cxx11::string::~string((string *)&local_ce8);
    std::__cxx11::string::~string((string *)&local_d08);
    std::__cxx11::string::~string((string *)&local_d28);
    std::__cxx11::string::~string((string *)&local_d48);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    std::operator+(&local_d88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0,
                   "_typename_list_");
    std::__cxx11::to_string(&local_da8,0);
    std::operator+(&local_d68,&local_d88,&local_da8);
    std::__cxx11::string::operator=
              ((string *)(expr_name_2.field_2._M_local_buf + 8),(string *)&local_d68);
    std::__cxx11::string::~string((string *)&local_d68);
    std::__cxx11::string::~string((string *)&local_da8);
    std::__cxx11::string::~string((string *)&local_d88);
    std::operator+(&local_e28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0);
    std::operator+(&local_e08,&local_e28," -- ");
    std::operator+(&local_de8,&local_e08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expr_name_2.field_2 + 8));
    std::operator+(&local_dc8,&local_de8,"\n");
    std::__cxx11::string::operator=(local_88,(string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_de8);
    std::__cxx11::string::~string((string *)&local_e08);
    std::__cxx11::string::~string((string *)&local_e28);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    local_e30 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(this_00);
    id.field_2._8_8_ = local_e30;
    while( true ) {
      local_e38._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(this_00);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                          *)((long)&id.field_2 + 8),&local_e38);
      if (!bVar3) break;
      std::operator+(&local_e78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_2.field_2 + 8),"_expr");
      std::__cxx11::to_string(&local_e98,list_name_2.field_2._12_4_);
      std::operator+(&local_e58,&local_e78,&local_e98);
      std::__cxx11::string::operator=
                ((string *)(tkind_2.field_2._M_local_buf + 8),(string *)&local_e58);
      std::__cxx11::string::~string((string *)&local_e58);
      std::__cxx11::string::~string((string *)&local_e98);
      std::__cxx11::string::~string((string *)&local_e78);
      list_name_2.field_2._12_4_ = list_name_2.field_2._12_4_ + 1;
      std::operator+(&local_f38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00)
      ;
      std::operator+(&local_f18,&local_f38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_2.field_2 + 8));
      std::operator+(&local_ef8,&local_f18," -- ");
      std::operator+(&local_ed8,&local_ef8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_2.field_2 + 8));
      std::operator+(&local_eb8,&local_ed8,"\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_eb8);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::__cxx11::string::~string((string *)&local_ed8);
      std::__cxx11::string::~string((string *)&local_ef8);
      std::__cxx11::string::~string((string *)&local_f18);
      std::__cxx11::string::~string((string *)&local_f38);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
      std::operator+(&local_1038,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00)
      ;
      std::operator+(&local_1018,&local_1038,"\t");
      std::operator+(&local_ff8,&local_1018,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_2.field_2 + 8));
      std::operator+(&local_fd8,&local_ff8," [label = \"");
      std::operator+(&local_fb8,&local_fd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_2.field_2 + 8));
      std::operator+(&local_f98,&local_fb8,"\\n ");
      ppcVar8 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                             *)((long)&id.field_2 + 8));
      pcVar6 = *ppcVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1058,pcVar6,&local_1059);
      std::operator+(&local_f78,&local_f98,&local_1058);
      std::operator+(&local_f58,&local_f78,"\"]\n");
      std::__cxx11::string::operator=(local_88,(string *)&local_f58);
      std::__cxx11::string::~string((string *)&local_f58);
      std::__cxx11::string::~string((string *)&local_f78);
      std::__cxx11::string::~string((string *)&local_1058);
      std::allocator<char>::~allocator(&local_1059);
      std::__cxx11::string::~string((string *)&local_f98);
      std::__cxx11::string::~string((string *)&local_fb8);
      std::__cxx11::string::~string((string *)&local_fd8);
      std::__cxx11::string::~string((string *)&local_ff8);
      std::__cxx11::string::~string((string *)&local_1018);
      std::__cxx11::string::~string((string *)&local_1038);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
      local_1068 = (char **)__gnu_cxx::
                            __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                            ::operator++((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                          *)((long)&id.field_2 + 8),0);
    }
    std::operator+(&local_1088,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0,
                   "_combiner");
    std::__cxx11::string::operator=((string *)local_be8,(string *)&local_1088);
    std::__cxx11::string::~string((string *)&local_1088);
    std::operator+(&local_1108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0);
    std::operator+(&local_10e8,&local_1108," -- ");
    std::operator+(&local_10c8,&local_10e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
    std::operator+(&local_10a8,&local_10c8,"\n");
    std::__cxx11::string::operator=(local_88,(string *)&local_10a8);
    std::__cxx11::string::~string((string *)&local_10a8);
    std::__cxx11::string::~string((string *)&local_10c8);
    std::__cxx11::string::~string((string *)&local_10e8);
    std::__cxx11::string::~string((string *)&local_1108);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&indent_3.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
                   "\t");
    std::operator+(&local_11c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&indent_3.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
    std::operator+(&local_11a8,&local_11c8," [label = \"");
    std::operator+(&local_1188,&local_11a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
    std::operator+(&local_1168,&local_1188,"\\n ");
    std::operator+(&local_1148,&local_1168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
    std::operator+(&local_1128,&local_1148,"\"]\n");
    std::__cxx11::string::operator=(local_88,(string *)&local_1128);
    std::__cxx11::string::~string((string *)&local_1128);
    std::__cxx11::string::~string((string *)&local_1148);
    std::__cxx11::string::~string((string *)&local_1168);
    std::__cxx11::string::~string((string *)&local_1188);
    std::__cxx11::string::~string((string *)&local_11a8);
    std::__cxx11::string::~string((string *)&local_11c8);
    std::__cxx11::string::~string((string *)(indent_3.field_2._M_local_buf + 8));
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),pcVar6);
    std::__cxx11::string::~string((string *)local_be8);
    std::__cxx11::string::~string((string *)local_bc0);
    std::__cxx11::string::~string((string *)(tkind_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(expr_name_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b58);
    std::__cxx11::string::~string((string *)(combiner.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b00);
  }
  iter._M_current = (OpenMPClause **)getClausesInOriginalOrder(this);
  sVar9 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size
                    ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)iter._M_current);
  if (sVar9 != 0) {
    __gnu_cxx::
    __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
    ::__normal_iterator(&stack0xffffffffffffebf8);
    local_140c = 0;
    local_1418 = (OpenMPClause **)
                 std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::begin
                           (iter._M_current);
    iStack_1408 = (iterator)local_1418;
    while( true ) {
      local_1420._M_current =
           (OpenMPClause **)
           std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::end(iter._M_current);
      bVar3 = __gnu_cxx::operator!=(&stack0xffffffffffffebf8,&local_1420);
      if (!bVar3) break;
      ppOVar10 = __gnu_cxx::
                 __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                 ::operator*(&stack0xffffffffffffebf8);
      uVar2 = local_140c;
      pOVar1 = *ppOVar10;
      std::__cxx11::string::string(local_1440,local_348);
      (*pOVar1->_vptr_OpenMPClause[1])
                (pOVar1,(undefined1 *)((long)&node_id.field_2 + 8),1,(ulong)uVar2,local_1440);
      std::__cxx11::string::~string(local_1440);
      local_140c = local_140c + 1;
      __gnu_cxx::
      __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
      ::operator++(&stack0xffffffffffffebf8,0);
    }
  }
  std::operator<<((ostream *)(node_id.field_2._M_local_buf + 8),"}\n");
  std::__cxx11::string::~string(local_348);
  std::ofstream::~ofstream((void *)((long)&node_id.field_2 + 8));
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void OpenMPDirective::generateDOT() {
    std::string directive_kind;
    OpenMPDirectiveKind kind = this->getKind();
    switch(kind) {
        case OMPD_cancellation_point :
                directive_kind = "cancellation_point " ;
                break;
        case OMPD_for_simd:
                directive_kind = "for_simd ";
                break;
        case OMPD_do_simd:
                directive_kind = "do_simd ";
                break;
        case OMPD_parallel_for_simd:
                directive_kind = "parallel_for_simd ";
                break;
        case OMPD_declare_simd:
                directive_kind = "declare_simd ";
                break;
        case OMPD_distribute_simd:
                directive_kind = "distribute_simd ";
                break;
        case OMPD_distribute_parallel_for:
                directive_kind = "distribute_parallel_for ";
                break;
        case OMPD_distribute_parallel_do:
                directive_kind = "distribute_parallel_do ";
                break;
        case OMPD_distribute_parallel_for_simd:
                directive_kind = "distribute_parallel_for_simd ";
                break;
        case OMPD_distribute_parallel_do_simd:
                directive_kind = "distribute_parallel_do_simd ";
                break;
        case OMPD_parallel_for:
                directive_kind = "parallel_for ";
                break;
        case OMPD_parallel_do:
                directive_kind = "parallel_do ";
                break;
        case OMPD_parallel_loop:
                directive_kind = "parallel_loop ";
                break;
        case OMPD_parallel_sections:
                directive_kind = "parallel_sections ";
                break;
        case OMPD_parallel_workshare:
                directive_kind += "parallel_workshare ";
                break;
        case OMPD_parallel_master:
                directive_kind += "parallel_master ";
                break;
        case OMPD_master_taskloop:
                directive_kind += "master_taskloop ";
                break;
        case OMPD_master_taskloop_simd:
                directive_kind += "master_taskloop_simd ";
                break;
        case OMPD_parallel_master_taskloop:
                directive_kind += "parallel_master_taskloop ";
                break;
        case OMPD_parallel_master_taskloop_simd:
                directive_kind += "parallel_master_taskloop_simd ";
                break;
        case OMPD_declare_reduction:
                directive_kind = "declare_reduction ";
                break;
        case OMPD_declare_mapper:
                directive_kind = "declare_mapper ";
                break;
        case OMPD_taskloop_simd:
                directive_kind = "taskloop_simd ";
                break;
        case OMPD_target_data:
                directive_kind = "target_data ";
                break;
        case OMPD_target_enter_data:
                directive_kind = "target_enter_data ";
                break;
        case OMPD_target_exit_data:
                directive_kind = "target_exit_data ";
                break;
        case OMPD_target_update:
                directive_kind = "target_update ";
                break;
        case OMPD_declare_target:
                directive_kind = "declare_target ";
                break;
        case OMPD_end_declare_target:
                directive_kind = "end_declare_target ";
                break;
        case OMPD_teams_distribute:
                directive_kind += "teams_distribute ";
                break;
        case OMPD_teams_distribute_simd:
                directive_kind += "teams_distribute_simd ";
                break;
        case OMPD_teams_distribute_parallel_for:
                directive_kind += "teams_distribute_parallel_for ";
                break;
        case OMPD_teams_distribute_parallel_for_simd:
                directive_kind += "teams_distribute_parallel_for_simd ";
                break;
        case OMPD_teams_loop:
                directive_kind += "teams_loop ";
                break;
        case OMPD_target_parallel:
                directive_kind += "target_parallel ";
                break;
        case OMPD_target_parallel_for:
                directive_kind += "target_parallel_for ";
                break;
        case OMPD_target_parallel_for_simd:
                directive_kind += "target_parallel_for_simd ";
                break;
        case OMPD_target_parallel_loop:
                directive_kind += "target_parallel_loop ";
                break;
        case OMPD_target_simd:
                directive_kind += "target_simd ";
                break;
        case OMPD_target_teams:
                directive_kind += "target_teams ";
                break;
        case OMPD_target_teams_distribute:
                directive_kind += "target_teams_distribute ";
                break;
        case OMPD_target_teams_distribute_simd:
                directive_kind += "target_teams_distribute_simd ";
                break;
        case OMPD_target_teams_loop:
                directive_kind += "target_teams_loop ";
                break;
        case OMPD_target_teams_distribute_parallel_for:
                directive_kind += "target_teams_distribute_parallel_for ";
                break;
        case OMPD_target_teams_distribute_parallel_for_simd:
                directive_kind += "target_teams_distribute_parallel_for simd ";
                break;
        case OMPD_teams_distribute_parallel_do:
                directive_kind += "teams distribute parallel do ";
                break;
        case OMPD_teams_distribute_parallel_do_simd:
                directive_kind += "teams distribute parallel do simd ";
                break;
        case OMPD_target_parallel_do:
                directive_kind += "target parallel do ";
                break;
        case OMPD_target_parallel_do_simd:
                directive_kind += "target parallel do simd ";
                break;
        case OMPD_target_teams_distribute_parallel_do:
                directive_kind += "target teams distribute parallel do ";
                break;
        case OMPD_target_teams_distribute_parallel_do_simd:
                directive_kind += "target teams distribute parallel do simd ";
                break;
        default:
                directive_kind = this->toString();
    }
    std::string current_line;

    current_line = "graph OpenMPIR_" + directive_kind + " {\n";

    std::string filename = "OpenMPIR_" + directive_kind.substr(0, directive_kind.size() - 1) + ".dot";
    std::ofstream output(filename.c_str());

    output << current_line.c_str();
    output << "\t" << directive_kind.c_str() << "\n";
    std::string node_id = "";
    switch (kind) {
        case OMPD_allocate: {
            std::string indent = std::string(1, '\t');
            std::vector<const char *> *list = ((OpenMPAllocateDirective *) this)->getAllocateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "allocate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
           break;
        }
        case OMPD_threadprivate: {
            std::string indent = std::string(1, '\t');
            std::vector<const char *> *list = ((OpenMPThreadprivateDirective*)this)->getThreadprivateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "threadprivate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
           break;
        }
        case OMPD_declare_reduction: {
            std::string indent = std::string(1, '\t');
            std::vector<const char*>* list = ((OpenMPDeclareReductionDirective*)this)->getTypenameList();
            std::vector<const char*>::iterator list_item;
            std::string id = ((OpenMPDeclareReductionDirective*)this)->getIdentifier();
            std::string combiner = ((OpenMPDeclareReductionDirective*)this)->getCombiner();
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "declare_reduction";
            std::string node_id = tkind + "_reduction_identifier";
            current_line = indent + tkind + " -- " + node_id + "\n";
            output << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + id + "\"]\n";
            output << current_line.c_str();
            list_name = tkind + "_typename_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
            node_id = tkind + "_combiner";
            current_line = indent + tkind + " -- " + node_id + "\n";
            output << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + combiner + "\"]\n";
            output << current_line.c_str();
           break;
        }
        case OMPD_declare_simd: {
            std::string indent = std::string(1, '\t');
            std::string proc_name = ((OpenMPDeclareSimdDirective*)this)->getProcName();
            std::string tkind = "declare_simd";
            std::string node_id = tkind + "_proc_name";
            if (proc_name != ""){
              current_line = indent + tkind + " -- " + node_id + "\n";
              output << current_line.c_str();
              current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + proc_name + "\"]\n";
              output << current_line.c_str();
            }
           break;
        }
        default: {
            node_id = directive_kind.substr(0, directive_kind.size() - 1);
        }
    };

    std::vector<OpenMPClause*>* clauses = this->getClausesInOriginalOrder();
    if (clauses->size() != 0) {
        std::vector<OpenMPClause*>::iterator iter;
        int clause_index = 0;
        for (iter = clauses->begin(); iter != clauses->end(); iter++) {
            (*iter)->generateDOT(output, 1, clause_index, node_id);
            clause_index += 1;
        };
    };

    output << "}\n";

}